

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_bs.c
# Opt level: O0

int jpc_bitstream_outalign(jpc_bitstream_t *bitstream,int filldata)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  uint local_30;
  uint local_2c;
  uint local_28;
  int local_24;
  int local_20;
  int v;
  int n;
  int filldata_local;
  jpc_bitstream_t *bitstream_local;
  
  if ((bitstream->openmode_ & 2U) == 0) {
    __assert_fail("bitstream->openmode_ & JPC_BITSTREAM_WRITE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_bs.c"
                  ,400,"int jpc_bitstream_outalign(jpc_bitstream_t *, int)");
  }
  if ((filldata & 0xffffffc0U) != 0) {
    __assert_fail("!(filldata & (~0x3f))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_bs.c"
                  ,0x196,"int jpc_bitstream_outalign(jpc_bitstream_t *, int)");
  }
  if (bitstream->cnt_ == 0) {
    if ((bitstream->buf_ & 0xff) == 0xff) {
      local_20 = 7;
      local_24 = filldata;
    }
    else {
      local_20 = 0;
      local_24 = 0;
    }
  }
  else {
    if ((bitstream->cnt_ < 1) || (7 < bitstream->cnt_)) {
      return 0;
    }
    local_20 = bitstream->cnt_;
    local_24 = filldata >> (7U - (char)local_20 & 0x1f);
  }
  if ((local_20 < 1) ||
     (iVar3 = jpc_bitstream_putbits(bitstream,local_20,(long)local_24), iVar3 == 0)) {
    if (bitstream->cnt_ < 8) {
      if ((bitstream->cnt_ < 0) || (7 < bitstream->cnt_)) {
        __assert_fail("bitstream->cnt_ >= 0 && bitstream->cnt_ < 8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_bs.c"
                      ,0x1b0,"int jpc_bitstream_outalign(jpc_bitstream_t *, int)");
      }
      if ((bitstream->buf_ & 0xff) == 0xff) {
        __assert_fail("(bitstream->buf_ & 0xff) != 0xff",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_bs.c"
                      ,0x1b1,"int jpc_bitstream_outalign(jpc_bitstream_t *, int)");
      }
      if ((bitstream->stream_->flags_ & 7U) == 0) {
        if ((bitstream->stream_->rwlimit_ < 0) ||
           (bitstream->stream_->rwcnt_ < bitstream->stream_->rwlimit_)) {
          bitstream->stream_->bufmode_ = bitstream->stream_->bufmode_ | 0x20;
          iVar3 = bitstream->stream_->cnt_ + -1;
          bitstream->stream_->cnt_ = iVar3;
          if (iVar3 < 0) {
            local_2c = jas_stream_flushbuf(bitstream->stream_,(uint)(byte)bitstream->buf_);
          }
          else {
            bitstream->stream_->rwcnt_ = bitstream->stream_->rwcnt_ + 1;
            bVar2 = (byte)bitstream->buf_;
            pbVar1 = bitstream->stream_->ptr_;
            bitstream->stream_->ptr_ = pbVar1 + 1;
            *pbVar1 = bVar2;
            local_2c = (uint)bVar2;
          }
          local_28 = local_2c;
        }
        else {
          bitstream->stream_->flags_ = bitstream->stream_->flags_ | 4;
          local_28 = 0xffffffff;
        }
        local_30 = local_28;
      }
      else {
        local_30 = 0xffffffff;
      }
      if (local_30 == 0xffffffff) {
        return -1;
      }
      bitstream->cnt_ = 8;
      bitstream->buf_ = (bitstream->buf_ & 0xff) << 8;
    }
    bitstream_local._4_4_ = 0;
  }
  else {
    bitstream_local._4_4_ = -1;
  }
  return bitstream_local._4_4_;
}

Assistant:

int jpc_bitstream_outalign(jpc_bitstream_t *bitstream, int filldata)
{
	int n;
	int v;

	/* Ensure that this bit stream is open for writing. */
	assert(bitstream->openmode_ & JPC_BITSTREAM_WRITE);

	/* Ensure that the first bit of fill data is zero. */
	/* Note: The first bit of fill data must be zero.  If this were not
	  the case, the fill data itself could cause further bit stuffing to
	  be required (which would cause numerous complications). */
	assert(!(filldata & (~0x3f)));

	if (!bitstream->cnt_) {
		if ((bitstream->buf_ & 0xff) == 0xff) {
			n = 7;
			v = filldata;
		} else {
			n = 0;
			v = 0;
		}
	} else if (bitstream->cnt_ > 0 && bitstream->cnt_ < 8) {
		n = bitstream->cnt_;
		v = filldata >> (7 - n);
	} else {
		n = 0;
		v = 0;
		return 0;
	}

	/* Write the appropriate fill data to the bit stream. */
	if (n > 0) {
		if (jpc_bitstream_putbits(bitstream, n, v)) {
			return -1;
		}
	}
	if (bitstream->cnt_ < 8) {
		assert(bitstream->cnt_ >= 0 && bitstream->cnt_ < 8);
		assert((bitstream->buf_ & 0xff) != 0xff);
		/* Force the pending byte of output to be written to the
		  underlying (character) stream. */
		if (jas_stream_putc(bitstream->stream_, bitstream->buf_ & 0xff) == EOF) {
			return -1;
		}
		bitstream->cnt_ = 8;
		bitstream->buf_ = (bitstream->buf_ << 8) & 0xffff;
	}

	return 0;
}